

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

json * __thiscall inja::Renderer::get_imm_abi_cxx11_(Renderer *this,Bytecode *bc)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  string_view sVar1;
  const_pointer __s;
  uint *out;
  string_view dot;
  vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  arguments;
  CallbackFunction callback;
  exception *anon_var_0;
  string local_d0;
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  string_view local_98;
  undefined1 local_78 [16];
  string_view local_68;
  undefined4 local_54;
  undefined1 local_50 [8];
  string_view ptr;
  string ptr_buffer;
  Bytecode *bc_local;
  Renderer *this_local;
  
  std::__cxx11::string::string((string *)&ptr._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  sVar1._M_str = (char *)ptr._M_len;
  sVar1._M_len = (size_t)local_50;
  out = &switchD_0014d8c1::switchdataD_00163f14;
  switch(*(uint *)&bc->field_0x4 >> 0x1e) {
  case 0:
    this_local = (Renderer *)0x0;
    goto LAB_0014dd9d;
  case 1:
    this_local = (Renderer *)&bc->value;
    goto LAB_0014dd9d;
  case 2:
    local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&bc->str);
    dot._M_str = (char *)&ptr._M_str;
    dot._M_len = local_78._8_8_;
    local_68 = convert_dot_to_json_pointer(local_78._0_8_,dot,(string *)out);
    sVar1 = local_68;
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)&ptr._M_str,'/');
    std::__cxx11::string::operator+=((string *)&ptr._M_str,(string *)&bc->str);
    local_98 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ptr._M_str);
    sVar1 = local_98;
  }
  ptr._M_len = (size_t)sVar1._M_str;
  local_50 = (undefined1  [8])sVar1._M_len;
  this_00 = this->m_data;
  __s = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,__s,(allocator<char> *)((long)&anon_var_0 + 7));
  nlohmann::
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_pointer(&local_b0,&local_d0);
  this_local = (Renderer *)
               nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(this_00,&local_b0);
  nlohmann::
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~json_pointer(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
LAB_0014dd9d:
  local_54 = 1;
  std::__cxx11::string::~string((string *)&ptr._M_str);
  return (json *)this_local;
}

Assistant:

const json* get_imm(const Bytecode& bc) {
    std::string ptr_buffer;
    nonstd::string_view ptr;
    switch (bc.flags & Bytecode::Flag::ValueMask) {
      case Bytecode::Flag::ValuePop:
        return nullptr;
      case Bytecode::Flag::ValueImmediate:
        return &bc.value;
      case Bytecode::Flag::ValueLookupDot:
        ptr = convert_dot_to_json_pointer(bc.str, ptr_buffer);
        break;
      case Bytecode::Flag::ValueLookupPointer:
        ptr_buffer += '/';
        ptr_buffer += bc.str;
        ptr = ptr_buffer;
        break;
    }
    try {
      return &m_data->at(json::json_pointer(ptr.data()));
    } catch (std::exception&) {
      // try to evaluate as a no-argument callback
      if (auto callback = m_callbacks.find_callback(bc.str, 0)) {
        std::vector<const json*> arguments {};
        m_tmp_val = callback(arguments);
        return &m_tmp_val;
      }
      inja_throw("render_error", "variable '" + static_cast<std::string>(bc.str) + "' not found");
      return nullptr;
    }
  }